

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChSolvmin.cpp
# Opt level: O3

void __thiscall
chrono::ChOptimizerGenetic::PopulationStats
          (ChOptimizerGenetic *this,double *average,double *max,double *min,double *stdeviation)

{
  double dVar1;
  double dVar2;
  int iVar3;
  ChGenotype **ppCVar4;
  ChGenotype *pCVar5;
  undefined8 uVar6;
  bool bVar7;
  int iVar8;
  long lVar9;
  long lVar10;
  double dVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  
  iVar8 = 0;
  *average = 0.0;
  *max = -999999999.0;
  *min = 999999999.0;
  *stdeviation = 0.0;
  iVar3 = *(int *)&(this->super_ChOptimizer).field_0x144;
  lVar9 = (long)iVar3;
  if (lVar9 < 1) {
    dVar11 = 0.0;
    *average = *average / 0.0;
  }
  else {
    auVar12._8_8_ = 0x7fffffffffffffff;
    auVar12._0_8_ = 0x7fffffffffffffff;
    ppCVar4 = this->population;
    lVar10 = 0;
    iVar8 = 0;
    do {
      pCVar5 = ppCVar4[lVar10];
      auVar14._8_8_ = 0;
      auVar14._0_8_ = pCVar5->fitness;
      auVar14 = vandpd_avx(auVar14,auVar12);
      if ((auVar14._0_8_ != 999999.0) || (NAN(auVar14._0_8_))) {
        *average = pCVar5->fitness + *average;
        dVar11 = pCVar5->fitness;
        if (*max < dVar11) {
          *max = dVar11;
          dVar11 = pCVar5->fitness;
        }
        iVar8 = iVar8 + 1;
        if (dVar11 < *min) {
          *min = dVar11;
        }
      }
      lVar10 = lVar10 + 1;
    } while (lVar9 != lVar10);
    dVar1 = *average;
    *average = dVar1 / (double)iVar8;
    if (iVar3 < 1) {
      dVar11 = 0.0;
    }
    else {
      dVar11 = 0.0;
      lVar10 = 0;
      do {
        ppCVar4 = this->population + lVar10;
        lVar10 = lVar10 + 1;
        dVar2 = (*ppCVar4)->fitness;
        auVar15._8_8_ = 0;
        auVar15._0_8_ = dVar2;
        auVar14 = vandpd_avx(auVar15,auVar12);
        dVar2 = dVar2 - dVar1 / (double)iVar8;
        uVar6 = vcmpsd_avx512f(auVar14,ZEXT816(0x412e847e00000000),4);
        bVar7 = (bool)((byte)uVar6 & 1);
        dVar11 = (double)((ulong)bVar7 * (long)(dVar11 + dVar2 * dVar2) +
                         (ulong)!bVar7 * (long)dVar11);
      } while (lVar9 != lVar10);
    }
  }
  auVar13._0_8_ = dVar11 / (double)(iVar8 + -1);
  auVar13._8_8_ = 0;
  if (auVar13._0_8_ < 0.0) {
    dVar11 = sqrt(auVar13._0_8_);
  }
  else {
    auVar12 = vsqrtsd_avx(auVar13,auVar13);
    dVar11 = auVar12._0_8_;
  }
  *stdeviation = dVar11;
  return;
}

Assistant:

void ChOptimizerGenetic::PopulationStats(double& average, double& max, double& min, double& stdeviation) {
    average = 0;
    max = -999999999;
    min = +999999999;
    stdeviation = 0;
    double variance = 0;
    int i;
    int sumind = 0;

    for (i = 0; i < popsize; i++) {
        if (fabs(population[i]->fitness) != OPT_IMPOSSIBLE) {
            sumind++;
            average += population[i]->fitness;
            if (population[i]->fitness > max)
                max = population[i]->fitness;
            if (population[i]->fitness < min)
                min = population[i]->fitness;
        }
    }
    average = average / (double)sumind;

    for (i = 0; i < popsize; i++) {
        if (fabs(population[i]->fitness) != OPT_IMPOSSIBLE) {
            variance += pow((population[i]->fitness - average), 2);
        }
    }
    variance = variance / (double)(sumind - 1);
    stdeviation = sqrt(variance);
}